

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

int cpu_ldsw_data_ra_aarch64(CPUArchState_conflict1 *env,target_ulong ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  
  uVar1 = load_helper(env,ptr,*(byte *)((long)&env->hflags + 3) & 0xf | 0x10,retaddr,MO_16,false,
                      full_le_lduw_mmu);
  return (int)(short)uVar1;
}

Assistant:

int cpu_ldsw_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldsw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}